

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall
Lowerer::GenerateFastBrTypeOf
          (Lowerer *this,Instr *branch,RegOpnd *object,IntConstOpnd *typeIdOpnd,Instr *typeOf,
          bool *pfNoLower,bool isNeqOp)

{
  TypeId typeIdToCheck;
  code *pcVar1;
  bool bVar2;
  uint32 offset;
  int iVar3;
  BailOutKind BVar4;
  undefined4 *puVar5;
  LabelInstr *done;
  LabelInstr *target;
  RegOpnd *typeOpnd;
  LabelInstr *pLVar6;
  IndirOpnd *pIVar7;
  Lowerer *dst;
  undefined4 extraout_var;
  IntConstOpnd *pIVar8;
  BailOutInfo *bailoutInfo;
  LabelInstr *labelTarget;
  OpCode OVar9;
  Lowerer *pLVar10;
  LabelInstr *target_00;
  
  typeIdToCheck = (TypeId)(typeIdOpnd->super_EncodableOpnd<long>).m_value;
  if (branch->m_kind != InstrKindBranch) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
    if (!bVar2) goto LAB_005e8b08;
    *puVar5 = 0;
  }
  target_00 = (LabelInstr *)branch[1].m_next;
  done = IR::LabelInstr::New(Label,this->m_func,false);
  target = IR::LabelInstr::New(Label,this->m_func,true);
  typeOpnd = IR::RegOpnd::New(TyInt64,this->m_func);
  OVar9 = branch->m_opcode;
  if (((0x15 < OVar9) || ((0x303000U >> (OVar9 & 0x1f) & 1) == 0)) && (3 < OVar9 - 0x194)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6289,"((0))","UNREACHED");
    if (!bVar2) {
LAB_005e8b08:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  pLVar6 = done;
  if (typeIdToCheck == TypeIds_Number) {
    pLVar6 = target_00;
  }
  labelTarget = target_00;
  if (pLVar6 == target_00) {
    labelTarget = done;
  }
  if (!isNeqOp) {
    labelTarget = pLVar6;
  }
  LowererMD::GenerateObjectTest(&this->m_lowererMD,&object->super_Opnd,branch,labelTarget,false);
  pIVar7 = IR::IndirOpnd::New(object,8,TyInt64,this->m_func,false);
  InsertMove(&typeOpnd->super_Opnd,&pIVar7->super_Opnd,branch,true);
  GenerateFalsyObjectTest(this,branch,typeOpnd,typeIdToCheck,target_00,done,isNeqOp);
  dst = (Lowerer *)IR::RegOpnd::New(TyInt32,this->m_func);
  offset = Js::Type::GetOffsetOfTypeId();
  pIVar7 = IR::IndirOpnd::New(typeOpnd,offset,TyInt32,this->m_func,false);
  pLVar10 = dst;
  InsertMove((Opnd *)dst,&pIVar7->super_Opnd,branch,true);
  pLVar6 = done;
  if (typeIdToCheck == TypeIds_Function) {
    object = (RegOpnd *)dst;
    if (!isNeqOp) {
      pLVar6 = target_00;
    }
  }
  else {
    if (typeIdToCheck != TypeIds_Object) {
      if (typeIdToCheck != TypeIds_Number) {
        InsertCompare((Opnd *)dst,&typeIdOpnd->super_Opnd,branch);
        OVar9 = isNeqOp | BrEq_A;
      }
      else {
        pIVar8 = IR::IntConstOpnd::New(3,TyInt32,branch->m_func,false);
        InsertSub(false,(Opnd *)dst,(Opnd *)dst,&pIVar8->super_Opnd,branch);
        pIVar8 = IR::IntConstOpnd::New(3,TyInt32,branch->m_func,false);
        InsertCompare((Opnd *)dst,&pIVar8->super_Opnd,branch);
        OVar9 = (ushort)!isNeqOp * 2 + BrGt_A;
      }
      InsertBranch(OVar9,typeIdToCheck == TypeIds_Number,target_00,branch);
      IR::Instr::InsertAfter(branch,&done->super_Instr);
      IR::Instr::Remove(typeOf);
      IR::Instr::Remove(branch);
      *pfNoLower = true;
      return;
    }
    if (!isNeqOp) {
      pLVar6 = target_00;
    }
    InsertCompareBranch(pLVar10,(Opnd *)dst,&typeIdOpnd->super_Opnd,BrGe_A,false,pLVar6,branch,false
                       );
    iVar3 = (**branch->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo)();
    pLVar10 = (Lowerer *)CONCAT44(extraout_var,iVar3);
    typeIdOpnd = (IntConstOpnd *)
                 IR::AddrOpnd::New((intptr_t)pLVar10,AddrOpndKindDynamicVar,branch->m_func,true,
                                   (Var)0x0);
  }
  InsertCompareBranch(pLVar10,&object->super_Opnd,&typeIdOpnd->super_Opnd,BrEq_A,false,pLVar6,branch
                      ,false);
  IR::Instr::InsertAfter(branch,&done->super_Instr);
  pLVar10 = (Lowerer *)0x1a;
  pIVar8 = IR::IntConstOpnd::New(0x1a,TyInt32,this->m_func,false);
  InsertCompareBranch(pLVar10,(Opnd *)dst,&pIVar8->super_Opnd,BrEq_A,false,target,branch,false);
  pLVar10 = (Lowerer *)0x17;
  pIVar8 = IR::IntConstOpnd::New(0x17,TyInt32,this->m_func,false);
  if (!isNeqOp) {
    target_00 = done;
  }
  InsertCompareBranch(pLVar10,(Opnd *)dst,&pIVar8->super_Opnd,BrNeq_A,false,target_00,branch,false);
  IR::Instr::InsertBefore(branch,&target->super_Instr);
  IR::Instr::Unlink(typeOf);
  IR::Instr::InsertBefore(branch,typeOf);
  if ((((branch->field_0x38 & 0x10) != 0) &&
      (BVar4 = IR::Instr::GetBailOutKind(branch),
      (BVar4 & ~(BailOutKindBits|BailOutIntOnly)) == BailOutOnImplicitCalls)) &&
     (((typeOf->field_0x38 & 0x10) == 0 ||
      (BVar4 = IR::Instr::GetBailOutKind(typeOf),
      (BVar4 & ~(BailOutKindBits|BailOutIntOnly)) != BailOutOnImplicitCalls)))) {
    bailoutInfo = IR::Instr::GetBailOutInfo(branch);
    BVar4 = IR::Instr::GetBailOutKind(branch);
    typeOf = AddBailoutToHelperCallInstr(this,typeOf,bailoutInfo,BVar4,branch);
  }
  LoadScriptContext(this,typeOf);
  LowerUnaryHelper(this,typeOf,HelperOp_Typeof,(Opnd *)0x0);
  return;
}

Assistant:

void
Lowerer::GenerateFastBrTypeOf(IR::Instr *branch, IR::RegOpnd *object, IR::IntConstOpnd *typeIdOpnd, IR::Instr *typeOf, bool *pfNoLower, bool isNeqOp)
{
    Js::TypeId      typeId   = static_cast<Js::TypeId>(typeIdOpnd->GetValue());
    IR::LabelInstr *target   = branch->AsBranchInstr()->GetTarget();
    IR::LabelInstr *done     = IR::LabelInstr::New(Js::OpCode::Label, m_func, false);
    IR::LabelInstr *helper = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
    IR::RegOpnd    *typeRegOpnd = IR::RegOpnd::New(TyMachReg, m_func);

    switch(branch->m_opcode)
    {
    case Js::OpCode::BrSrNeq_A:
    case Js::OpCode::BrNeq_A:
    case Js::OpCode::BrSrNotEq_A:
    case Js::OpCode::BrNotEq_A:
    case Js::OpCode::BrSrEq_A:
    case Js::OpCode::BrEq_A:
    case Js::OpCode::BrSrNotNeq_A:
    case Js::OpCode::BrNotNeq_A:
        break;
    default:
        Assert(UNREACHED);
        __assume(UNREACHED);
    }
    // JNE/BNE (typeId == Js::TypeIds_Number) ? $target : $done
    IR::LabelInstr *label = (typeId == Js::TypeIds_Number) ? target : done;
    if (isNeqOp)
        label = (label == target) ? done : target;

    m_lowererMD.GenerateObjectTest(object, branch, label);

    // MOV typeRegOpnd, [object + offset(Type)]
    InsertMove(typeRegOpnd,
               IR::IndirOpnd::New(object, Js::RecyclableObject::GetOffsetOfType(), TyMachReg, m_func),
               branch);

    GenerateFalsyObjectTest(branch, typeRegOpnd, typeId, target, done, isNeqOp);

    // MOV objTypeId, [typeRegOpnd + offset(TypeId)]
    IR::RegOpnd* objTypeIdOpnd = IR::RegOpnd::New(TyInt32, m_func);
    InsertMove(objTypeIdOpnd,
               IR::IndirOpnd::New(typeRegOpnd, Js::Type::GetOffsetOfTypeId(), TyInt32, m_func),
               branch);

    // CMP objTypeId, typeId
    // JEQ/JGE $done
    if (typeId == Js::TypeIds_Object)
    {
        InsertCompareBranch(objTypeIdOpnd, typeIdOpnd, Js::OpCode::BrGe_A, isNeqOp ? done : target, branch);
    }
    else if (typeId == Js::TypeIds_Function)
    {
        InsertCompareBranch(objTypeIdOpnd, typeIdOpnd, Js::OpCode::BrEq_A, isNeqOp ? done : target, branch);
    }
    else if (typeId == Js::TypeIds_Number)
    {
        //Check for the typeIds between  TypeIds_FirstNumberType <= typeIds <= TypeIds_LastNumberType
        InsertSub(false, objTypeIdOpnd, objTypeIdOpnd, IR::IntConstOpnd::New(Js::TypeIds_FirstNumberType, TyInt32, branch->m_func),branch);

        InsertCompare(objTypeIdOpnd, IR::IntConstOpnd::New(Js::TypeIds_LastNumberType - Js::TypeIds_FirstNumberType, TyInt32, branch->m_func), branch);
        InsertBranch(isNeqOp ? Js::OpCode::BrGt_A : Js::OpCode::BrLe_A, true, target, branch);
    }
    else
    {
        InsertCompare(objTypeIdOpnd, typeIdOpnd, branch);
        InsertBranch(isNeqOp ? Js::OpCode::BrNeq_A : Js::OpCode::BrEq_A, target, branch);
    }

    // This could be 'null' which, for historical reasons, has a TypeId < TypeIds_Object but
    // is still a Javascript "object."
    if (typeId == Js::TypeIds_Object)
    {
        // CMP object, 0xXXXXXXXX
        // JEQ isNeqOp ? $done : $target
        InsertCompareBranch(object,
                            LoadLibraryValueOpnd(branch, LibraryValue::ValueNull),
                            Js::OpCode::BrEq_A,
                            isNeqOp ? done : target,
                            branch);
    }

    branch->InsertAfter(done); // Get this label first

    // "object" or "function" may come from HostDispatch. Needs helper if that's the case.
    if (typeId == Js::TypeIds_Object || typeId == Js::TypeIds_Function)
    {
        // CMP objTypeId, TypeIds_Proxy. typeof proxy could be 'object' or 'function' depends on the target
        // JNE isNeqOp ? $target : $done
        InsertCompareBranch(objTypeIdOpnd,
            IR::IntConstOpnd::New(Js::TypeIds_Proxy, TyInt32, m_func),
            Js::OpCode::BrEq_A,
            helper,
            branch);

        // CMP objTypeId, TypeIds_HostDispatch
        // JNE isNeqOp ? $target : $done
        InsertCompareBranch(objTypeIdOpnd,
                            IR::IntConstOpnd::New(Js::TypeIds_HostDispatch, TyInt32, m_func),
                            Js::OpCode::BrNeq_A,
                            isNeqOp ? target : done,
                            branch);

        // Now emit Typeof and lower it like we would've for the helper call.
        {
            branch->InsertBefore(helper);
            typeOf->Unlink();
            branch->InsertBefore(typeOf);
            if (branch->HasBailOutInfo() && BailOutInfo::IsBailOutOnImplicitCalls(branch->GetBailOutKind()) &&
                (!typeOf->HasBailOutInfo() || !BailOutInfo::IsBailOutOnImplicitCalls(typeOf->GetBailOutKind())))
            {
                typeOf = AddBailoutToHelperCallInstr(typeOf, branch->GetBailOutInfo(), branch->GetBailOutKind(), branch);
            }
            LowerUnaryHelperMem(typeOf, IR::HelperOp_Typeof);
        }
    }
    else // Other primitive types don't need helper
    {
        typeOf->Remove();
        branch->Remove();
        *pfNoLower = true;
    }

    // $done:
}